

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

void hurtle(int dx,int dy,int range,boolean verbose)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  char *pcVar4;
  char *pcVar5;
  coord cc;
  coord uc;
  int local_28;
  undefined4 local_24;
  
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),range);
  if ((uball == (obj *)0x0) || (uball->where == '\x03')) {
    if (u.utrap == 0) {
      iVar2 = sgn(dx);
      iVar3 = sgn(dy);
      if (((local_28 != 0) && (iVar2 != 0 || iVar3 != 0)) && (u.ustuck == (monst *)0x0)) {
        nomul(-local_28,"moving through the air");
        if (verbose != '\0') {
          pcVar5 = "float";
          if (1 < local_28) {
            pcVar5 = "hurtle";
          }
          pline("You %s in the opposite direction.",pcVar5);
        }
        if (m_shot.i < m_shot.n) {
          pcVar5 = "shoot";
          if (m_shot.s == '\0') {
            pcVar5 = "throw";
          }
          pcVar4 = "shot";
          if (m_shot.s == '\0') {
            pcVar4 = "toss";
          }
          pline("You stop %sing after the first %s.",pcVar5,pcVar4);
          m_shot.n = m_shot.i;
        }
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          sokoban_trickster();
        }
        cVar1 = (char)_local_28;
        _local_28 = CONCAT26(CONCAT11(u.uy,u.ux),
                             CONCAT15((char)iVar3 * cVar1 + u.uy,
                                      CONCAT14((char)iVar2 * cVar1 + u.ux,local_28)));
        walk_path((coord *)((long)&local_24 + 2),(coord *)&local_24,hurtle_step,&local_28);
      }
      return;
    }
    if (((u.utraptype != 2) && (u.utraptype != 3)) && (u.utraptype == 4)) {
      surface((int)u.ux,(int)u.uy);
    }
    pline("You are anchored by the %s.");
  }
  else {
    pline("You feel a tug from the iron ball.");
  }
  nomul(0,(char *)0x0);
  return;
}

Assistant:

void hurtle(int dx, int dy, int range, boolean verbose)
{
    coord uc, cc;

    /* The chain is stretched vertically, so you shouldn't be able to move
     * very far diagonally.  The premise that you should be able to move one
     * spot leads to calculations that allow you to only move one spot away
     * from the ball, if you are levitating over the ball, or one spot
     * towards the ball, if you are at the end of the chain.  Rather than
     * bother with all of that, assume that there is no slack in the chain
     * for diagonal movement, give the player a message and return.
     */
    if (Punished && !carried(uball)) {
	pline("You feel a tug from the iron ball.");
	nomul(0, NULL);
	return;
    } else if (u.utrap) {
	pline("You are anchored by the %s.",
	    u.utraptype == TT_WEB ? "web" : u.utraptype == TT_LAVA ? "lava" :
		u.utraptype == TT_INFLOOR ? surface(u.ux,u.uy) : "trap");
	nomul(0, NULL);
	return;
    }

    /* make sure dx and dy are [-1,0,1] */
    dx = sgn(dx);
    dy = sgn(dy);

    if (!range || (!dx && !dy) || u.ustuck) return; /* paranoia */

    nomul(-range, "moving through the air");
    if (verbose)
	pline("You %s in the opposite direction.", range > 1 ? "hurtle" : "float");
    /* if we're in the midst of shooting multiple projectiles, stop */
    if (m_shot.i < m_shot.n) {
	/* last message before hurtling was "you shoot N arrows" */
	pline("You stop %sing after the first %s.",
	    m_shot.s ? "shoot" : "throw", m_shot.s ? "shot" : "toss");
	m_shot.n = m_shot.i;	/* make current shot be the last */
    }
    if (In_sokoban(&u.uz))
	sokoban_trickster();	/* Sokoban guilt */
    uc.x = u.ux;
    uc.y = u.uy;
    /* this setting of cc is only correct if dx and dy are [-1,0,1] only */
    cc.x = u.ux + (dx * range);
    cc.y = u.uy + (dy * range);
    walk_path(&uc, &cc, hurtle_step, &range);
}